

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::SetAccessors
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,Var getter,
          Var setter,PropertyOperationFlags flags)

{
  bool bVar1;
  DynamicType *type;
  PathTypeHandlerBase *pPVar2;
  DictionaryTypeHandler *this_00;
  PropertyOperationFlags flags_local;
  Var setter_local;
  Var getter_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  type = DynamicObject::GetDynamicType(instance);
  bVar1 = DoConvertToPathType(type);
  if (bVar1) {
    pPVar2 = ConvertToPathType(this,instance);
    this_local._4_4_ =
         (*(pPVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x34])
                   (pPVar2,instance,(ulong)(uint)propertyId,getter,setter,(ulong)flags);
  }
  else {
    this_00 = ConvertToDictionaryType(this,instance);
    this_local._4_4_ =
         DictionaryTypeHandlerBase<unsigned_short>::SetAccessors
                   (this_00,instance,propertyId,getter,setter,flags);
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetAccessors(DynamicObject* instance, PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        if (DoConvertToPathType(instance->GetDynamicType()))
        {
            return ConvertToPathType(instance)->SetAccessors(instance, propertyId, getter, setter, flags);
        }
        else
        {
            // Don't attempt to share cross-site function types
            return ConvertToDictionaryType(instance)->SetAccessors(instance, propertyId, getter, setter, flags);
        }
    }